

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_> * __thiscall
kj::Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_>::operator=
          (Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_> *this,
          Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_> *other)

{
  Disposer *object;
  Dispose_<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>,_true> *this_00;
  PromiseFulfiller<kj::Own<capnp::ClientHook>_> *pPVar1;
  Disposer *in_RDX;
  
  object = this->disposer;
  this_00 = (Dispose_<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>,_true> *)this->ptr;
  pPVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pPVar1;
  other->ptr = (PromiseFulfiller<kj::Own<capnp::ClientHook>_> *)0x0;
  if (this_00 != (Dispose_<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>,_true> *)0x0) {
    Disposer::Dispose_<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>,_true>::dispose
              (this_00,(PromiseFulfiller<kj::Own<capnp::ClientHook>_> *)object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }